

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

void jsondec_listvalue(jsondec *d,upb_Message *msg,upb_MessageDef *m)

{
  _Bool _Var1;
  upb_FieldDef *f;
  upb_MessageDef *m_00;
  upb_MiniTable *m_01;
  upb_MutableMessageValue arr;
  upb_Message *msg_00;
  undefined8 extraout_RDX;
  upb_MessageValue val;
  
  if (((ulong)msg->field_0 & 1) == 0) {
    f = upb_MessageDef_FindFieldByNumber(m,1);
    m_00 = upb_FieldDef_MessageSubDef(f);
    m_01 = upb_MessageDef_MiniTable(m_00);
    arr = upb_Message_Mutable(msg,f,d->arena);
    jsondec_arrstart(d);
    while( true ) {
      _Var1 = jsondec_seqnext(d,']');
      if (!_Var1) break;
      msg_00 = upb_Message_New(m_01,d->arena);
      val.str_val.size = extraout_RDX;
      val.msg_val = msg_00;
      upb_Array_Append(arr.array,val,d->arena);
      jsondec_wellknownvalue(d,msg_00,m_00);
    }
    d->depth = d->depth + 1;
    jsondec_wsch(d,']');
    return;
  }
  __assert_fail("!upb_Message_IsFrozen(msg)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                ,0x4bc,"void jsondec_listvalue(jsondec *, upb_Message *, const upb_MessageDef *)");
}

Assistant:

static void jsondec_listvalue(jsondec* d, upb_Message* msg,
                              const upb_MessageDef* m) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  const upb_FieldDef* values_f = upb_MessageDef_FindFieldByNumber(m, 1);
  const upb_MessageDef* value_m = upb_FieldDef_MessageSubDef(values_f);
  const upb_MiniTable* value_layout = upb_MessageDef_MiniTable(value_m);
  upb_Array* values = upb_Message_Mutable(msg, values_f, d->arena).array;

  jsondec_arrstart(d);
  while (jsondec_arrnext(d)) {
    upb_Message* value_msg = upb_Message_New(value_layout, d->arena);
    upb_MessageValue value;
    value.msg_val = value_msg;
    upb_Array_Append(values, value, d->arena);
    jsondec_wellknownvalue(d, value_msg, value_m);
  }
  jsondec_arrend(d);
}